

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

bool __thiscall CCNR::ls_solver::parse_arguments(ls_solver *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long in_RDX;
  int in_ESI;
  string *in_RDI;
  int i;
  bool flag_inst;
  int local_28;
  
  bVar1 = false;
  local_28 = 1;
  do {
    if (in_ESI <= local_28) {
      return bVar1;
    }
    iVar2 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"-inst");
    if (iVar2 == 0) {
      local_28 = local_28 + 1;
      if (in_ESI <= local_28) {
        return false;
      }
      std::__cxx11::string::operator=(in_RDI,*(char **)(in_RDX + (long)local_28 * 8));
      bVar1 = true;
    }
    else {
      iVar2 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"-seed");
      if (iVar2 == 0) {
        local_28 = local_28 + 1;
        if (in_ESI <= local_28) {
          return false;
        }
        __isoc99_sscanf(*(undefined8 *)(in_RDX + (long)local_28 * 8),"%d",in_RDI + 0xb08);
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool ls_solver::parse_arguments(int argc, char **argv)
{
    bool flag_inst = false;
    for (int i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-inst") == 0) {
            i++;
            if (i >= argc) return false;
            _inst_file = argv[i];
            flag_inst = true;
            continue;
        } else if (strcmp(argv[i], "-seed") == 0) {
            i++;
            if (i >= argc) return false;
            sscanf(argv[i], "%d", &_random_seed);
            continue;
        }
    }
    if (flag_inst)
        return true;
    else
        return false;
}